

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O2

char * __thiscall
ELFIO::section_impl<ELFIO::Elf32_Shdr>::get_data(section_impl<ELFIO::Elf32_Shdr> *this)

{
  bool bVar1;
  
  if ((this->is_loaded == false) && (this->can_be_loaded == true)) {
    bVar1 = load_data(this);
    if (!bVar1) {
      this->can_be_loaded = false;
    }
  }
  return (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
}

Assistant:

const char* get_data() const override
    {
        // If data load failed, the stream is corrupt
        // When lazy loading, attempts to call get_data() on it after initial load are useless
        // When loading non-lazily, that load_data() will attempt to read data from 
        // the stream specified on load() call, which might be freed by this point
        if ( !is_loaded && can_be_loaded ) {
            bool res = load_data();

            if ( !res ) {
                can_be_loaded = false;
            }
        }
        return data.get();
    }